

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O3

int __thiscall deqp::egl::BufferAgeTests::init(BufferAgeTests *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  TestContext **this_00;
  pointer *ppDVar2;
  int iVar3;
  EglTestContext *eglTestCtx;
  deUint32 dVar4;
  int extraout_EAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar5;
  TestCaseGroup *this_01;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes;
  undefined8 *puVar6;
  TestCase *this_02;
  allocator_type *paVar7;
  undefined8 *puVar8;
  long lVar9;
  char *pcVar10;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *extraout_RDX_00;
  undefined8 unaff_RBX;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *pvVar11;
  undefined8 uVar12;
  _anonymous_namespace_ *this_03;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *pvVar13;
  string name;
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  frameDrawTypes;
  DrawType renderClear [2];
  DrawType clearRender [2];
  value_type local_168;
  undefined8 uStack_150;
  undefined4 local_13c;
  TestNode *local_138;
  TestCaseGroup *local_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  TestContext **local_108;
  allocator_type *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  uint local_dc;
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  local_d8;
  _anonymous_namespace_ *local_c0;
  _anonymous_namespace_ *local_b8;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_b0;
  _anonymous_namespace_ *local_a8;
  _anonymous_namespace_ *local_a0;
  DrawType local_98 [4];
  string local_88;
  long local_68;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_60;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_58;
  string local_50;
  
  local_98[2] = DRAWTYPE_GLES2_CLEAR;
  local_98[3] = DRAWTYPE_GLES2_RENDER;
  local_98[0] = DRAWTYPE_GLES2_RENDER;
  local_98[1] = DRAWTYPE_GLES2_CLEAR;
  local_d8.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = (TestNode *)this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  if (local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  *local_168.
   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = DRAWTYPE_GLES2_CLEAR;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  if (local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  *local_168.
   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = DRAWTYPE_GLES2_RENDER;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  if (local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start[0] = DRAWTYPE_GLES2_CLEAR;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = DRAWTYPE_GLES2_CLEAR;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  if (local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  paVar7 = (allocator_type *)
           ((long)local_168.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start + 8);
  *(undefined1 **)
   local_168.
   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = &DAT_100000001;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar7;
  local_168.
  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar7;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  if ((pointer *)
      local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_168,local_98 + 2,(DrawType *)&local_88,paVar7);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  if ((pointer *)
      local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_168,local_98,local_98 + 2,paVar7);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&local_d8,&local_168);
  uVar5 = extraout_RAX;
  if ((pointer *)
      local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_168.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    uVar5 = extraout_RAX_00;
  }
  ppDVar2 = &local_168.
             super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar12 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  local_13c = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
  do {
    this_01 = (TestCaseGroup *)operator_new(0x78);
    local_dc = (uint)uVar12;
    pcVar10 = "no_preserve";
    if ((char)uVar12 != '\0') {
      pcVar10 = "preserve";
    }
    TestCaseGroup::TestCaseGroup
              (this_01,(EglTestContext *)local_138[1]._vptr_TestNode,pcVar10,
               glcts::fixed_sample_locations_values + 1);
    lVar9 = 0;
    do {
      iVar3 = (&DAT_01b96ee8)[lVar9];
      local_68 = lVar9;
      local_130 = (TestCaseGroup *)operator_new(0x78);
      eglTestCtx = (EglTestContext *)local_138[1]._vptr_TestNode;
      local_168.
      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppDVar2;
      if (iVar3 == 2) {
        local_100 = (allocator_type *)0x11;
        local_168.
        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_168,(ulong)&local_100);
        *(undefined8 *)
         local_168.
         super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
         ._M_impl.super__Vector_impl_data._M_start = 0x615f657a69736572;
        pcVar10 = (char *)((long)local_168.
                                 super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 8);
        pcVar10[0] = 'f';
        pcVar10[1] = 't';
        pcVar10[2] = 'e';
        pcVar10[3] = 'r';
        pcVar10[4] = '_';
        pcVar10[5] = 's';
        pcVar10[6] = 'w';
        pcVar10[7] = 'a';
        *(char *)((long)local_168.
                        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x10) = 'p';
LAB_00e46c13:
        local_168.
        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_100;
        *(allocator_type *)
         ((long)local_168.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_100) = (allocator_type)0x0;
        local_168.
        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_100;
      }
      else {
        if (iVar3 == 1) {
          local_100 = (allocator_type *)0x12;
          local_168.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_168,(ulong)&local_100);
          *(undefined8 *)
           local_168.
           super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
           ._M_impl.super__Vector_impl_data._M_start = 0x625f657a69736572;
          pcVar10 = (char *)((long)local_168.
                                   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 8);
          pcVar10[0] = 'e';
          pcVar10[1] = 'f';
          pcVar10[2] = 'o';
          pcVar10[3] = 'r';
          pcVar10[4] = 'e';
          pcVar10[5] = '_';
          pcVar10[6] = 's';
          pcVar10[7] = 'w';
          ((char *)((long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10))[0] = 'a';
          ((char *)((long)local_168.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10))[1] = 'p';
          goto LAB_00e46c13;
        }
        if (iVar3 == 0) {
          local_168.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7a697365725f6f6e;
          local_168.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x9;
          uStack_150 = CONCAT62(uStack_150._2_6_,0x65);
        }
        else {
          local_168.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)local_168.
                                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
        }
      }
      TestCaseGroup::TestCaseGroup
                (local_130,eglTestCtx,
                 (char *)local_168.
                         super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 glcts::fixed_sample_locations_values + 1);
      if ((pointer *)
          local_168.
          super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_start != ppDVar2) {
        operator_delete(local_168.
                        super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)local_168.
                                      super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      }
      local_c0 = (_anonymous_namespace_ *)
                 local_d8.
                 super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_d8.
                super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        pvVar11 = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)(((long)local_d8.
                             super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_d8.
                             super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
        local_b8 = (_anonymous_namespace_ *)
                   local_d8.
                   super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        drawTypes = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                     *)0x0;
        local_60 = pvVar11;
        do {
          local_b0 = drawTypes;
          if (drawTypes < pvVar11) {
            local_a8 = local_c0 + (long)drawTypes * 0x18;
            this_03 = local_b8;
            pvVar13 = drawTypes;
            do {
              local_a0 = this_03;
              local_58 = pvVar13;
              egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
                        (&local_50,this_03,drawTypes);
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1b96d07);
              paVar7 = (allocator_type *)(puVar6 + 2);
              if ((allocator_type *)*puVar6 == paVar7) {
                local_f0 = *(long *)paVar7;
                uStack_e8 = puVar6[3];
                local_100 = (allocator_type *)&local_f0;
              }
              else {
                local_f0 = *(long *)paVar7;
                local_100 = (allocator_type *)*puVar6;
              }
              local_f8 = puVar6[1];
              *puVar6 = paVar7;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
              puVar8 = puVar6 + 2;
              if ((pointer *)*puVar6 == (pointer *)puVar8) {
                local_168.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
                uStack_150 = puVar6[3];
                local_168.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)ppDVar2;
              }
              else {
                local_168.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
                local_168.
                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar6;
              }
              local_168.
              super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar6[1];
              *puVar6 = puVar8;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
                        (&local_88,local_a8,
                         (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                          *)local_168.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
              paVar7 = (allocator_type *)0xf;
              if ((pointer *)
                  local_168.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start != ppDVar2) {
                paVar7 = (allocator_type *)
                         local_168.
                         super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              if (paVar7 < (allocator_type *)
                           ((long)local_168.
                                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish +
                           local_88._M_string_length)) {
                uVar5 = (allocator_type *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  uVar5 = local_88.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar5 <
                    (allocator_type *)
                    ((long)local_168.
                           super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                           ._M_impl.super__Vector_impl_data._M_finish + local_88._M_string_length))
                goto LAB_00e46e11;
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_88,0,(char *)0x0,
                                    (ulong)local_168.
                                           super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
              }
              else {
LAB_00e46e11:
                puVar6 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_168,(ulong)local_88._M_dataplus._M_p);
              }
              local_128 = &local_118;
              plVar1 = puVar6 + 2;
              if ((long *)*puVar6 == plVar1) {
                local_118 = *plVar1;
                uStack_110 = puVar6[3];
              }
              else {
                local_118 = *plVar1;
                local_128 = (long *)*puVar6;
              }
              local_120 = puVar6[1];
              *puVar6 = plVar1;
              puVar6[1] = 0;
              *(undefined1 *)plVar1 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,
                                (ulong)(local_88.field_2._M_allocated_capacity + 1));
              }
              if ((pointer *)
                  local_168.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start != ppDVar2) {
                operator_delete(local_168.
                                super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)local_168.
                                              super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                       ));
              }
              if (local_100 != (allocator_type *)&local_f0) {
                operator_delete(local_100,local_f0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              this_02 = (TestCase *)operator_new(0x1b18);
              plVar1 = local_128;
              TestCase::TestCase(this_02,(EglTestContext *)local_138[1]._vptr_TestNode,
                                 (char *)local_128,glcts::fixed_sample_locations_values + 1);
              (this_02->super_TestCase).super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__BufferAgeTest_02110d70;
              dVar4 = deStringHash((char *)plVar1);
              *(deUint32 *)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode = dVar4;
              *(char *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
                   (char)local_13c;
              this_00 = &this_02[1].super_TestCase.super_TestNode.m_testCtx;
              std::
              vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)this_00,
                       (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)local_a0);
              local_108 = this_00;
              std::
              vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
              ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)&this_02[1].super_TestCase.super_TestNode.m_name.field_2,
                       (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                        *)local_a8);
              *(undefined4 *)
               &this_02[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
              this_02[1].super_TestCase.super_TestNode.m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              this_02[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity =
                   0;
              *(undefined8 *)
               ((long)&this_02[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
              *(undefined8 *)&this_02[1].super_TestCase.super_TestNode.m_nodeType = 0;
              glw::Functions::Functions
                        ((Functions *)
                         &this_02[1].super_TestCase.super_TestNode.m_children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              *(undefined8 *)&this_02[0x39].super_TestCase.super_TestNode.m_nodeType = 0;
              this_02[0x39].super_TestCase.super_TestNode.m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              tcu::TestNode::addChild((TestNode *)local_130,(TestNode *)this_02);
              pvVar13 = local_58;
              pvVar11 = local_60;
              drawTypes = extraout_RDX;
              if (local_128 != &local_118) {
                operator_delete(local_128,local_118 + 1);
                drawTypes = extraout_RDX_00;
              }
              pvVar13 = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                         *)((long)&(pvVar13->
                                   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1);
              this_03 = local_a0 + 0x18;
            } while (pvVar13 < pvVar11);
          }
          drawTypes = (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                       *)((long)&(local_b0->
                                 super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
          local_b8 = local_b8 + 0x18;
        } while (drawTypes < pvVar11);
      }
      tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)local_130);
      lVar9 = local_68 + 1;
    } while (lVar9 != 3);
    tcu::TestNode::addChild(local_138,(TestNode *)this_01);
    local_13c = 0;
    uVar12 = 0;
    if ((local_dc & 1) == 0) {
      std::
      vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
      ::~vector(&local_d8);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void BufferAgeTests::init (void)
{
	const BufferAgeTest::DrawType clearRender[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR,
		BufferAgeTest::DRAWTYPE_GLES2_RENDER
	};

	const BufferAgeTest::DrawType renderClear[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_RENDER,
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR
	};

	const BufferAgeTest::ResizeType resizeTypes[] =
	{
		BufferAgeTest::RESIZETYPE_NONE,
		BufferAgeTest::RESIZETYPE_BEFORE_SWAP,
		BufferAgeTest::RESIZETYPE_AFTER_SWAP
	};

	vector< vector<BufferAgeTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> ());
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
		{
			const BufferAgeTest::ResizeType	resizeType	= resizeTypes[resizeTypeNdx];
			TestCaseGroup* const			resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

			for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
			{
				const vector<BufferAgeTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

				for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
				{
					const vector<BufferAgeTest::DrawType>&	oddFrameDrawType	= frameDrawTypes[oddNdx];
					const std::string						name				= generateTestName(oddFrameDrawType, evenFrameDrawType);
					resizeGroup->addChild(new BufferAgeTest(m_eglTestCtx, preserve, oddFrameDrawType, evenFrameDrawType, BufferAgeTest::RESIZETYPE_NONE, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(resizeGroup);
		}
		addChild(preserveGroup);
	}
}